

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompilerIdNode::Evaluate
          (string *__return_storage_ptr__,CompilerIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  ostream *poVar1;
  ostringstream e;
  string local_1e8;
  string local_1c8;
  string local_1a8 [11];
  
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar1 = std::operator<<((ostream *)local_1a8,"$<");
    poVar1 = std::operator<<(poVar1,this->CompilerLanguage);
    std::operator<<(poVar1,
                    "_COMPILER_ID> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
                   );
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1e8,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_1e8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,this->CompilerLanguage,(allocator<char> *)&local_1e8);
    EvaluateWithLanguage
              (__return_storage_ptr__,this,parameters,context,content,dagChecker,local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (!context->HeadTarget) {
      std::ostringstream e;
      e << "$<" << this->CompilerLanguage
        << "_COMPILER_ID> may only be used with binary targets.  It may "
           "not be used with add_custom_command or add_custom_target.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return {};
    }
    return this->EvaluateWithLanguage(parameters, context, content, dagChecker,
                                      this->CompilerLanguage);
  }